

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void P_CheckPlayerSprite(AActor *actor,int *spritenum,DVector2 *scale)

{
  double dVar1;
  uint uVar2;
  player_t *ppVar3;
  FPlayerSkin *pFVar4;
  int iVar5;
  Node *pNVar6;
  undefined4 extraout_var;
  Node *pNVar8;
  Node *pNVar9;
  hash_t hVar10;
  ulong uVar11;
  int *piVar12;
  PClass *pPVar7;
  
  ppVar3 = actor->player;
  pNVar8 = (ppVar3->userinfo).
           super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Nodes;
  hVar10 = (ppVar3->userinfo).
           super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Size;
  uVar11 = (ulong)(hVar10 - 1 & 0x1ea);
  pNVar9 = pNVar8 + uVar11;
  do {
    pNVar6 = pNVar9;
    pNVar9 = pNVar6->Next;
  } while ((pNVar6->Pair).Key.Index != 0x1ea);
  if ((*(int *)&(pNVar6->Pair).Value[1]._vptr_FBaseCVar != 0) &&
     (((actor->flags4).Value & 0x20) == 0)) {
    pPVar7 = (actor->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar5 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar5);
      (actor->super_DThinker).super_DObject.Class = pPVar7;
      pNVar8 = (ppVar3->userinfo).
               super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Nodes;
      hVar10 = (ppVar3->userinfo).
               super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Size;
      uVar11 = (ulong)(hVar10 - 1 & 0x1ea);
    }
    pFVar4 = skins;
    dVar1 = *(double *)(pPVar7->Defaults + 0xe0);
    pNVar9 = pNVar8 + uVar11;
    do {
      pNVar6 = pNVar9;
      pNVar9 = pNVar6->Next;
    } while ((pNVar6->Pair).Key.Index != 0x1ea);
    scale->X = (skins[*(int *)&(pNVar6->Pair).Value[1]._vptr_FBaseCVar].Scale.X /
               *(double *)(pPVar7->Defaults + 0xd8)) * scale->X;
    pNVar9 = pNVar8 + uVar11;
    do {
      pNVar6 = pNVar9;
      pNVar9 = pNVar6->Next;
    } while ((pNVar6->Pair).Key.Index != 0x1ea);
    scale->Y = (pFVar4[*(int *)&(pNVar6->Pair).Value[1]._vptr_FBaseCVar].Scale.Y / dVar1) * scale->Y
    ;
  }
  if (0.75 < ppVar3->crouchfactor || ppVar3->crouchfactor == 0.75) {
    return;
  }
  uVar2 = *spritenum;
  if ((uVar2 == actor->SpawnState->sprite) ||
     (uVar2 == *(uint *)&(ppVar3->mo->super_AActor).field_0x49c)) {
    piVar12 = (int *)&(ppVar3->mo->super_AActor).field_0x49c;
  }
  else {
    if (((actor->flags4).Value & 0x20) != 0) goto LAB_00583c37;
    pNVar8 = pNVar8 + (hVar10 - 1 & 0x1ea);
    pNVar9 = pNVar8;
    do {
      pNVar6 = pNVar9;
      pNVar9 = pNVar6->Next;
    } while ((pNVar6->Pair).Key.Index != 0x1ea);
    pNVar9 = pNVar8;
    if (uVar2 != skins[*(int *)&(pNVar6->Pair).Value[1]._vptr_FBaseCVar].sprite) {
      do {
        pNVar6 = pNVar9;
        pNVar9 = pNVar6->Next;
      } while ((pNVar6->Pair).Key.Index != 0x1ea);
      if (uVar2 != skins[*(int *)&(pNVar6->Pair).Value[1]._vptr_FBaseCVar].crouchsprite)
      goto LAB_00583c37;
    }
    do {
      pNVar9 = pNVar8;
      pNVar8 = pNVar9->Next;
    } while ((pNVar9->Pair).Key.Index != 0x1ea);
    piVar12 = &skins[*(int *)&(pNVar9->Pair).Value[1]._vptr_FBaseCVar].crouchsprite;
  }
  if (0 < *piVar12) {
    *spritenum = *piVar12;
    return;
  }
LAB_00583c37:
  if (ppVar3->playerstate != '\x01') {
    scale->Y = scale->Y * 0.5;
  }
  return;
}

Assistant:

void P_CheckPlayerSprite(AActor *actor, int &spritenum, DVector2 &scale)
{
	player_t *player = actor->player;
	int crouchspriteno;

	if (player->userinfo.GetSkin() != 0 && !(actor->flags4 & MF4_NOSKIN))
	{
		// Convert from default scale to skin scale.
		DVector2 defscale = actor->GetDefault()->Scale;
		scale.X *= skins[player->userinfo.GetSkin()].Scale.X / defscale.X;
		scale.Y *= skins[player->userinfo.GetSkin()].Scale.Y / defscale.Y;
	}

	// Set the crouch sprite?
	if (player->crouchfactor < 0.75)
	{
		if (spritenum == actor->SpawnState->sprite || spritenum == player->mo->crouchsprite) 
		{
			crouchspriteno = player->mo->crouchsprite;
		}
		else if (!(actor->flags4 & MF4_NOSKIN) &&
				(spritenum == skins[player->userinfo.GetSkin()].sprite ||
				 spritenum == skins[player->userinfo.GetSkin()].crouchsprite))
		{
			crouchspriteno = skins[player->userinfo.GetSkin()].crouchsprite;
		}
		else
		{ // no sprite -> squash the existing one
			crouchspriteno = -1;
		}

		if (crouchspriteno > 0) 
		{
			spritenum = crouchspriteno;
		}
		else if (player->playerstate != PST_DEAD && player->crouchfactor < 0.75)
		{
			scale.Y *= 0.5;
		}
	}
}